

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool jsonip::parser::
     seq_<jsonip::parser::char_<(char)47>,jsonip::parser::char_<(char)47>,jsonip::parser::apply_until_<jsonip::parser::notchar_<(char)10>,jsonip::parser::new_line>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  pointer *ppSVar1;
  char cVar2;
  iterator iVar3;
  char *pcVar4;
  bool bVar5;
  Reader *pRVar6;
  PositionType p;
  char *pcVar7;
  pointer pSVar8;
  PositionType pcVar9;
  undefined1 auStack_20 [8];
  State cur_state;
  
  auStack_20 = (undefined1  [8])state->reader_->pos_;
  cur_state.pos_ = (PositionType)state->line_;
  iVar3._M_current =
       (state->stack_).
       super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (state->stack_).
      super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
    ::
    _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
              ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                *)&state->stack_,iVar3,(State *)auStack_20);
  }
  else {
    (iVar3._M_current)->pos_ = (PositionType)auStack_20;
    (iVar3._M_current)->line_ = (size_t)cur_state.pos_;
    ppSVar1 = &(state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pRVar6 = state->reader_;
  pcVar4 = pRVar6->pos_;
  pcVar7 = pcVar4;
  if (((long)pcVar4 - (long)pRVar6->buf_ != pRVar6->len_) && (*pcVar4 == '/')) {
    pcVar7 = pcVar4 + 1;
    pRVar6->pos_ = pcVar7;
    if (((long)pcVar7 - (long)pRVar6->buf_ != pRVar6->len_) && (*pcVar7 == '/')) {
      auStack_20 = (undefined1  [8])(pcVar4 + 2);
      pRVar6->pos_ = (PositionType)auStack_20;
      cur_state.pos_ = (PositionType)state->line_;
      iVar3._M_current =
           (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (state->stack_).
          super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
        ::
        _M_realloc_insert<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State_const&>
                  ((vector<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State,std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>::State>>
                    *)&state->stack_,iVar3,(State *)auStack_20);
      }
      else {
        (iVar3._M_current)->pos_ = (PositionType)auStack_20;
        (iVar3._M_current)->line_ = (size_t)cur_state.pos_;
        ppSVar1 = &(state->stack_).
                   super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
      pRVar6 = state->reader_;
      pcVar7 = pRVar6->pos_;
      if ((long)pcVar7 - (long)pRVar6->buf_ != pRVar6->len_) {
        pcVar9 = pRVar6->buf_ + (pRVar6->len_ - (long)pcVar7);
        do {
          cVar2 = *pcVar7;
          pcVar7 = pcVar7 + 1;
          pRVar6->pos_ = pcVar7;
          if (cVar2 == '\n') {
            state->line_ = state->line_ + 1;
            if (state->max_pos_ < pcVar7) {
              state->max_pos_ = pcVar7;
            }
            pSVar8 = (state->stack_).
                     super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
            bVar5 = true;
            goto LAB_001151c5;
          }
          pcVar9 = pcVar9 + -1;
        } while (pcVar9 != (PositionType)0x0);
      }
      if (state->max_pos_ < pcVar7) {
        state->max_pos_ = pcVar7;
      }
      pcVar7 = (state->stack_).
               super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
      pRVar6->pos_ = pcVar7;
      ppSVar1 = &(state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
    }
  }
  if (state->max_pos_ < pcVar7) {
    state->max_pos_ = pcVar7;
  }
  pRVar6->pos_ = (state->stack_).
                 super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].pos_;
  pSVar8 = (state->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  state->line_ = pSVar8[-1].line_;
  bVar5 = false;
LAB_001151c5:
  (state->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar8 + -1;
  return bVar5;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) && C1::match(state) &&
                       C2::match(state) && C3::match(state) &&
                       C4::match(state) && C5::match(state) &&
                       C6::match(state) && C7::match(state);
            var ? state.commit() : state.rollback();

            return var;
        }